

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

FIOBJ fiobj_data_alloc(void *buffer,int fd)

{
  undefined1 *puVar1;
  FIOBJ FVar2;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 uVar3;
  void *buffer_00;
  
  uVar3 = CONCAT44(in_register_00000034,fd);
  buffer_00 = (void *)0x38;
  puVar1 = (undefined1 *)fio_malloc(0x38);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x2b;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(void **)(puVar1 + 8) = buffer;
    *(undefined8 *)(puVar1 + 0x10) = 0;
    *(undefined8 *)(puVar1 + 0x18) = 0;
    *(undefined8 *)(puVar1 + 0x20) = 0;
    *(undefined8 *)(puVar1 + 0x28) = 0;
    *(int *)(puVar1 + 0x30) = fd;
    return (FIOBJ)puVar1;
  }
  fiobj_data_alloc_cold_1();
  FVar2 = fiobj_data_alloc(buffer_00,-1);
  *(undefined8 *)(FVar2 + 0x18) = uVar3;
  *(undefined8 *)(FVar2 + 0x20) = uVar3;
  *(undefined8 *)(FVar2 + 0x10) = extraout_RDX;
  return FVar2;
}

Assistant:

static FIOBJ fiobj_data_alloc(void *buffer, int fd) {
  fiobj_data_s *io = fio_malloc(sizeof(*io));
  REQUIRE_MEM(io);
  *io = (fiobj_data_s){
      .head = {.ref = 1, .type = FIOBJ_T_DATA},
      .buffer = buffer,
      .fd = fd,
  };
  return (FIOBJ)io;
}